

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O2

UnicodeSet * __thiscall
icu_63::UnicodeSet::applyPattern(UnicodeSet *this,UnicodeString *pattern,UErrorCode *status)

{
  short sVar1;
  int iVar2;
  int32_t i;
  ParsePosition pos;
  
  pos.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_00467010;
  pos.index = 0;
  pos.errorIndex = -1;
  applyPatternIgnoreSpace(this,pattern,&pos,(SymbolTable *)0x0,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    i = pos.index;
    ICU_Utility::skipWhitespace(pattern,&i,'\x01');
    sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar2 = (pattern->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)sVar1 >> 5;
    }
    if (i != iVar2) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  ParsePosition::~ParsePosition(&pos);
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::applyPattern(const UnicodeString& pattern,
                                     UErrorCode& status) {
    // Equivalent to
    //   return applyPattern(pattern, USET_IGNORE_SPACE, NULL, status);
    // but without dependency on closeOver().
    ParsePosition pos(0);
    applyPatternIgnoreSpace(pattern, pos, NULL, status);
    if (U_FAILURE(status)) return *this;

    int32_t i = pos.getIndex();
    // Skip over trailing whitespace
    ICU_Utility::skipWhitespace(pattern, i, TRUE);
    if (i != pattern.length()) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    return *this;
}